

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::processBrokerConfigureCommands(CoreBroker *this,ActionMessage *cmd)

{
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view lfile;
  bool bVar1;
  ActionMessage *in_RSI;
  long in_RDI;
  bad_any_cast *anon_var_0;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  callback;
  optional<std::any> locker;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  BrokerBase *in_stack_fffffffffffffef0;
  any *in_stack_fffffffffffffef8;
  BrokerBase *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  AirLock<std::any,_std::mutex,_std::condition_variable> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  int iVar2;
  BrokerBase *in_stack_ffffffffffffff30;
  
  iVar2 = in_RSI->messageID;
  if ((iVar2 == 0x2f) || (iVar2 == 0x10f)) {
    ActionMessage::getExtraData((ActionMessage *)0x5f2f74);
    BrokerBase::setLogLevel(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  }
  else if (iVar2 == 0x250) {
    bVar1 = checkActionFlag<helics::ActionMessage,helics::MessageFlags>(in_RSI,empty_flag);
    if (bVar1) {
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)in_stack_fffffffffffffef0,
                 (nullptr_t)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      BrokerBase::setLoggerFunction
                (in_stack_ffffffffffffff30,
                 (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)CONCAT44(iVar2,in_stack_ffffffffffffff28));
      CLI::std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x5f2fdf);
    }
    else {
      CLI::std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL>
      ::operator[]((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL>
                    *)in_stack_fffffffffffffef0,
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                (in_stack_ffffffffffffff18);
      bVar1 = std::optional::operator_cast_to_bool((optional<std::any> *)0x5f3046);
      if (bVar1) {
        std::optional<std::any>::operator*((optional<std::any> *)0x5f305c);
        std::
        any_cast<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
                  (in_stack_fffffffffffffef8);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffef0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
                   (char *)in_stack_fffffffffffffef8);
        __args_1._M_str = in_stack_ffffffffffffff10;
        __args_1._M_len = in_stack_ffffffffffffff08;
        __args_2._M_str = (char *)in_stack_ffffffffffffff00;
        __args_2._M_len = (size_t)in_stack_fffffffffffffef8;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,__args_1,__args_2);
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)in_stack_fffffffffffffef0,
                   (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        BrokerBase::setLoggerFunction
                  (in_stack_ffffffffffffff30,
                   (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)CONCAT44(iVar2,in_stack_ffffffffffffff28));
        CLI::std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *)0x5f3111);
        CLI::std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *)0x5f311e);
      }
      std::optional<std::any>::~optional((optional<std::any> *)0x5f31ca);
    }
  }
  else if (iVar2 == 0x252) {
    SmallBuffer::to_string((SmallBuffer *)0x5f31fc);
    lfile._M_str = in_stack_ffffffffffffff10;
    lfile._M_len = in_stack_ffffffffffffff08;
    BrokerBase::setLoggingFile(in_stack_ffffffffffffff00,lfile);
  }
  else if ((iVar2 == 0x25f) &&
          (bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                             (in_RSI,indicator_flag), bVar1)) {
    BrokerBase::setTickForwarding((BrokerBase *)(in_RDI + 8),PING_RESPONSE,true);
  }
  return;
}

Assistant:

void CoreBroker::processBrokerConfigureCommands(ActionMessage& cmd)
{
    switch (cmd.messageID) {
        case defs::Flags::ENABLE_INIT_ENTRY:
            /*if (delayInitCounter <= 1)
        {
            delayInitCounter = 0;
            if (allInitReady())
            {
                BrokerState exp = CONNECTED;
                if (brokerState.compare_exchange_strong(exp, BrokerState::INITIALIZING))
                {  // make sure we only do this once
                    checkDependencies();
                    cmd.setAction(CMD_INIT);
                    cmd.source_id = global_broker_id_local;
                    cmd.dest_id = 0;
                    transmit(0, cmd);
                }
            }
        }
        else
        {
            --delayInitCounter;
        }
        break;
        */
        case defs::Properties::LOG_LEVEL:
            setLogLevel(cmd.getExtraData());
            break;
        case UPDATE_LOGGING_CALLBACK:
            if (checkActionFlag(cmd, empty_flag)) {
                setLoggerFunction(nullptr);
            } else {
                auto locker = dataAirlocks[cmd.counter].try_unload();
                if (locker) {
                    try {
                        auto callback = std::any_cast<
                            std::function<void(int, std::string_view, std::string_view)>>(
                            std::move(*locker));
                        callback(0, identifier, "logging callback activated");
                        setLoggerFunction(std::move(callback));
                    }
                    catch (const std::bad_any_cast&) {
                        // This shouldn't really happen unless someone is being malicious so just
                        // ignore it for now.
                        ;
                    }
                }
            }
            break;
        case UPDATE_LOGGING_FILE:
            setLoggingFile(cmd.payload.to_string());
            break;
        case REQUEST_TICK_FORWARDING:
            if (checkActionFlag(cmd, indicator_flag)) {
                setTickForwarding(TickForwardingReasons::PING_RESPONSE, true);
            }
            break;
        default:
            break;
    }
}